

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readandsynthesis.cpp
# Opt level: O1

void anon_unknown.dwarf_11a::usage(char *argv)

{
  putchar(10);
  printf(" %s - synthesis from three parameters\n",argv);
  putchar(10);
  puts("  usage:");
  printf("   %s input.f0 input.sp input.ap [option]\n",argv);
  puts("  option:");
  puts("   -o name : filename used for output          [output.wav]");
  putchar(10);
  return;
}

Assistant:

void usage(char *argv) {
  printf("\n");
  printf(" %s - synthesis from three parameters\n", argv);
  printf("\n");
  printf("  usage:\n");
  printf("   %s input.f0 input.sp input.ap [option]\n", argv);
  printf("  option:\n");
  printf("   -o name : filename used for output          [output.wav]\n");
  printf("\n");
}